

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

HTTPAPIEX_HANDLE
createIotHubHttpApiExHandle(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *u2bLLClientData)

{
  HTTPAPIEX_RESULT HVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t curl_verbose;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTPAPIEX_HANDLE iotHubHttpApiExHandle;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *u2bLLClientData_local;
  
  iotHubHttpApiExHandle = (HTTPAPIEX_HANDLE)u2bLLClientData;
  l = (LOGGER_LOG)HTTPAPIEX_Create(u2bLLClientData->hostname);
  if ((HTTPAPIEX_HANDLE)l == (HTTPAPIEX_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
             ,"createIotHubHttpApiExHandle",0x199,1,"unable to HTTPAPIEX_Create");
    }
  }
  else if ((iotHubHttpApiExHandle[3].httpHandle == (HTTP_HANDLE)0x0) ||
          (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"timeout",
                                       &iotHubHttpApiExHandle[3].httpHandle), HVar1 == HTTPAPIEX_OK)
          ) {
    if (iotHubHttpApiExHandle[3].k != 0) {
      l_2 = (LOGGER_LOG)(long)(int)(uint)(iotHubHttpApiExHandle[3].k == 1);
      HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"CURLOPT_VERBOSE",&l_2);
    }
    if ((iotHubHttpApiExHandle[3].savedOptions == (VECTOR_HANDLE)0x0) ||
       (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"CURLOPT_INTERFACE",
                                    iotHubHttpApiExHandle[3].savedOptions), HVar1 == HTTPAPIEX_OK))
    {
      if (((*(int *)&iotHubHttpApiExHandle->savedOptions == 2) ||
          (*(int *)&iotHubHttpApiExHandle->savedOptions == 3)) &&
         ((((((((ulong)iotHubHttpApiExHandle[4].hostName & 1) == 1 &&
              (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"tls_renegotiation",
                                           iotHubHttpApiExHandle + 4), HVar1 != HTTPAPIEX_OK)) ||
             (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,OPTION_X509_CERT,
                                          iotHubHttpApiExHandle[1].hostName), HVar1 != HTTPAPIEX_OK)
             ) || (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,OPTION_X509_PRIVATE_KEY,
                                               *(void **)&iotHubHttpApiExHandle[1].k),
                  HVar1 != HTTPAPIEX_OK)) ||
           ((iotHubHttpApiExHandle[1].httpHandle != (HTTP_HANDLE)0x0 &&
            (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"x509PrivatekeyType",
                                         iotHubHttpApiExHandle[1].httpHandle), HVar1 != HTTPAPIEX_OK
            )))) || ((iotHubHttpApiExHandle[1].savedOptions != (VECTOR_HANDLE)0x0 &&
                     (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"Engine",
                                                  iotHubHttpApiExHandle[1].savedOptions),
                     HVar1 != HTTPAPIEX_OK)))))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"createIotHubHttpApiExHandle",0x1bb,1,
                    "unable to HTTPAPIEX_SetOption for x509 certificate");
        }
        HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
      else if ((iotHubHttpApiExHandle[2].hostName == (STRING_HANDLE)0x0) ||
              (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"TrustedCerts",
                                           iotHubHttpApiExHandle[2].hostName), HVar1 == HTTPAPIEX_OK
              )) {
        if ((*(long *)&iotHubHttpApiExHandle[2].k != 0) &&
           (HVar1 = HTTPAPIEX_SetOption((HTTPAPIEX_HANDLE)l,"proxy_data",&iotHubHttpApiExHandle[2].k
                                       ), HVar1 != HTTPAPIEX_OK)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"createIotHubHttpApiExHandle",0x1c9,1,"unable to set http proxy!");
          }
          HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"createIotHubHttpApiExHandle",0x1c2,1,"unable to set TrustedCerts!");
        }
        HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"createIotHubHttpApiExHandle",0x1ad,1,"unable to set networkInteface!");
      }
      HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  else {
    curl_verbose = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)curl_verbose != (LOGGER_LOG)0x0) {
      (*(code *)curl_verbose)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"createIotHubHttpApiExHandle",0x19e,1,"unable to set blob transfer timeout");
    }
    HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)l);
    l = (LOGGER_LOG)0x0;
  }
  return (HTTPAPIEX_HANDLE)l;
}

Assistant:

static HTTPAPIEX_HANDLE createIotHubHttpApiExHandle(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* u2bLLClientData)
{
    HTTPAPIEX_HANDLE iotHubHttpApiExHandle = HTTPAPIEX_Create(u2bLLClientData->hostname);

    if (iotHubHttpApiExHandle == NULL)
    {
        LogError("unable to HTTPAPIEX_Create");
    }
    else if (u2bLLClientData->blob_upload_timeout_millisecs != 0 &&
             HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_HTTP_TIMEOUT, &u2bLLClientData->blob_upload_timeout_millisecs) != HTTPAPIEX_OK)
    {
        LogError("unable to set blob transfer timeout");
        HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
        iotHubHttpApiExHandle = NULL;
    }
    else
    {
        if (u2bLLClientData->curl_verbosity_level != UPLOADTOBLOB_CURL_VERBOSITY_UNSET)
        {
            size_t curl_verbose = (u2bLLClientData->curl_verbosity_level == UPLOADTOBLOB_CURL_VERBOSITY_ON);
            (void)HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_CURL_VERBOSE, &curl_verbose);
        }

        if ((u2bLLClientData->networkInterface) != NULL &&
            (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_CURL_INTERFACE, u2bLLClientData->networkInterface) != HTTPAPIEX_OK))
        {
            LogError("unable to set networkInteface!");
            HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
            iotHubHttpApiExHandle = NULL;
        }
        else
        {
            /*transmit the x509certificate and x509privatekey*/
            if ((u2bLLClientData->cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || u2bLLClientData->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC) &&
                    (((u2bLLClientData->tls_renegotiation == true) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_SET_TLS_RENEGOTIATION, &u2bLLClientData->tls_renegotiation) != HTTPAPIEX_OK)) ||
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_X509_CERT, u2bLLClientData->credentials.x509_credentials.x509certificate) != HTTPAPIEX_OK) ||
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_X509_PRIVATE_KEY, u2bLLClientData->credentials.x509_credentials.x509privatekey) != HTTPAPIEX_OK) ||
                    ((u2bLLClientData->credentials.x509_credentials.x509privatekeyType != NULL) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_OPENSSL_PRIVATE_KEY_TYPE, u2bLLClientData->credentials.x509_credentials.x509privatekeyType) != HTTPAPIEX_OK)) ||
                    ((u2bLLClientData->credentials.x509_credentials.engine != NULL) && (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_OPENSSL_ENGINE, u2bLLClientData->credentials.x509_credentials.engine) != HTTPAPIEX_OK))))
            {
                LogError("unable to HTTPAPIEX_SetOption for x509 certificate");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            else if ((u2bLLClientData->certificates != NULL) &&
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_TRUSTED_CERT, u2bLLClientData->certificates) != HTTPAPIEX_OK))
            {
                LogError("unable to set TrustedCerts!");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            else if ((u2bLLClientData->http_proxy_options.host_address != NULL) &&
                    (HTTPAPIEX_SetOption(iotHubHttpApiExHandle, OPTION_HTTP_PROXY, &(u2bLLClientData->http_proxy_options)) != HTTPAPIEX_OK))
            {
                LogError("unable to set http proxy!");
                HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
                iotHubHttpApiExHandle = NULL;
            }
            // TODO: proxy username and password can be set through SetOption, but are not used (it was the previous behavior as well). Bug?
        }
    }

    return iotHubHttpApiExHandle;
}